

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

Var Js::JavascriptMap::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var aValue;
  Var pvVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *nextFunc;
  RecyclableObject *instance;
  JavascriptMethod p_Var9;
  int in_stack_00000010;
  Arguments local_c0;
  undefined1 local_b0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  Var local_70;
  CallInfo local_68;
  CallInfo callInfo_local;
  Var key;
  RecyclableObject *local_50;
  CallInfo local_48;
  JavascriptMap *local_40;
  char local_31;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_68 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x1e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cd2c69;
    *puVar6 = 0;
  }
  __tag.entry.next = (Entry *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,&local_68);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = (CallInfo)(pSVar1->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_b0,function,local_68,L"Map",&stack0x00000000);
  aValue = CallInfo::GetNewTarget
                     ((uint)__tag.entry.next >> 0x18,(Var *)&stack0x00000018,
                      (uint)__tag.entry.next & 0xffffff);
  local_c0.Info = (Type)__tag.entry.next;
  local_c0.Values = (Type)&stack0x00000018;
  cVar4 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_c0);
  if (((ulong)local_68 & 0x1000000) == 0) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Map");
  }
  local_40 = JavascriptLibrary::CreateMap((JavascriptLibrary *)local_48);
  if (local_40 == (JavascriptMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x31,"(mapObject != nullptr)","mapObject != nullptr");
    if (!bVar3) goto LAB_00cd2c69;
    *puVar6 = 0;
  }
  if (((ulong)__tag.entry.next & 0xfffffe) == 0) {
    pvVar7 = *(Var *)((long)local_48 + 0x430);
  }
  else {
    pvVar7 = Arguments::operator[]((Arguments *)&__tag.entry.next,1);
  }
  if (local_40->kind == EmptyMap) {
    BVar5 = JavascriptConversion::CheckObjectCoercible(pvVar7,pSVar1);
    if (BVar5 != 0) {
      local_50 = JavascriptOperators::GetIterator(pvVar7,pSVar1,false);
      pvVar7 = JavascriptOperators::GetPropertyNoCache((RecyclableObject *)local_40,0x19b,pSVar1);
      bVar3 = JavascriptConversion::IsCallable(pvVar7);
      if (!bVar3) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
      }
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
      if (local_50 != (RecyclableObject *)0x0) {
        local_48 = *(CallInfo *)((long)local_48 + 0x430);
        local_70 = (Var)0x0;
        local_31 = cVar4;
        nextFunc = JavascriptOperators::CacheIteratorNext(local_50,pSVar1);
        while (bVar3 = JavascriptOperators::IteratorStepAndValue(local_50,pSVar1,nextFunc,&local_70)
              , pvVar7 = local_70, cVar4 = local_31, bVar3) {
          BVar5 = JavascriptOperators::IsObject(local_70);
          if (BVar5 == 0) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec71,(PCWSTR)0x0);
          }
          instance = VarTo<Js::RecyclableObject>(pvVar7);
          callInfo_local = (CallInfo)0x0;
          key = (Var)0x0;
          BVar5 = JavascriptOperators::GetItem(instance,0,(Var *)&callInfo_local,pSVar1);
          if (BVar5 == 0) {
            callInfo_local = local_48;
          }
          BVar5 = JavascriptOperators::GetItem(instance,1,&key,pSVar1);
          if (BVar5 == 0) {
            key = (Var)local_48;
          }
          this = pSVar1->threadContext;
          bVar3 = this->reentrancySafeOrHandled;
          this->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
          if (pSVar1->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
          CheckIsExecutable(pRVar8,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
          (*p_Var9)(pRVar8,(CallInfo)pRVar8,0x2000003,0,0,0,0,0x2000003,local_40,callInfo_local,key)
          ;
          this->reentrancySafeOrHandled = bVar3;
        }
      }
    }
    if (cVar4 != '\0') {
      pRVar8 = VarTo<Js::RecyclableObject>(aValue);
      local_40 = (JavascriptMap *)
                 JavascriptOperators::OrdinaryCreateFromConstructor
                           (pRVar8,(RecyclableObject *)local_40,(DynamicObject *)0x0,pSVar1);
    }
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_b0);
    return local_40;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                              ,0x38,"((0))","UNREACHED");
  if (bVar3) {
    *puVar6 = 0;
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec06,L"Map");
  }
LAB_00cd2c69:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Var JavascriptMap::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map"));

    Var newTarget = args.GetNewTarget();
    bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Map, scriptContext);

    JavascriptMap* mapObject = nullptr;

    if (callInfo.Flags & CallFlags_New)
    {
        mapObject = library->CreateMap();
    }
    else
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map"), _u("Map"));
    }
    Assert(mapObject != nullptr);

    Var iterable = (args.Info.Count > 1) ? args[1] : library->GetUndefined();

    // REVIEW: This condition seems impossible?
    if (mapObject->kind != MapKind::EmptyMap)
    {
        Assert(UNREACHED);
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_ObjectIsAlreadyInitialized, _u("Map"), _u("Map"));
    }

    RecyclableObject* iter = nullptr;
    RecyclableObject* adder = nullptr;

    if (JavascriptConversion::CheckObjectCoercible(iterable, scriptContext))
    {
        iter = JavascriptOperators::GetIterator(iterable, scriptContext);
        Var adderVar = JavascriptOperators::GetPropertyNoCache(mapObject, PropertyIds::set, scriptContext);
        if (!JavascriptConversion::IsCallable(adderVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        adder = VarTo<RecyclableObject>(adderVar);
    }

    if (iter != nullptr)
    {
        Var undefined = library->GetUndefined();

        JavascriptOperators::DoIteratorStepAndValue(iter, scriptContext, [&](Var nextItem) {
            if (!JavascriptOperators::IsObject(nextItem))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
            }

            RecyclableObject* obj = VarTo<RecyclableObject>(nextItem);

            Var key = nullptr, value = nullptr;

            if (!JavascriptOperators::GetItem(obj, 0u, &key, scriptContext))
            {
                key = undefined;
            }

            if (!JavascriptOperators::GetItem(obj, 1u, &value, scriptContext))
            {
                value = undefined;
            }

            // CONSIDER: if adder is the default built-in, fast path it and skip the JS call?
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(), adder, CallInfo(CallFlags_Value, 3), mapObject, key, value);
            }
            END_SAFE_REENTRANT_CALL
        });
    }

    return isCtorSuperCall ?
        JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), mapObject, nullptr, scriptContext) :
        mapObject;
}